

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O3

void __thiscall
soul::heart::Printer::PrinterStream::printArgList
          (PrinterStream *this,ArrayView<soul::pool_ref<soul::heart::Expression>_> *args)

{
  pool_ref<soul::heart::Expression> *ppVar1;
  CodePrinter *this_00;
  bool bVar2;
  size_t sVar3;
  pool_ref<soul::heart::Expression> *arg;
  pool_ref<soul::heart::Expression> *ppVar4;
  string_view text;
  string_view text_00;
  string_view text_01;
  char s [2];
  char local_42 [2];
  string local_40;
  
  if (args->s != args->e) {
    text._M_str = " (";
    text._M_len = 2;
    choc::text::CodePrinter::writeBlock(this->out,text);
    ppVar4 = args->s;
    ppVar1 = args->e;
    if (ppVar4 != ppVar1) {
      bVar2 = true;
      do {
        if (!bVar2) {
          text_00._M_str = ", ";
          text_00._M_len = 2;
          choc::text::CodePrinter::writeBlock(this->out,text_00);
        }
        printExpression(this,ppVar4->object);
        ppVar4 = ppVar4 + 1;
        bVar2 = false;
      } while (ppVar4 != ppVar1);
    }
    this_00 = this->out;
    local_42[0] = ')';
    local_42[1] = '\0';
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    sVar3 = strlen(local_42);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,local_42,local_42 + sVar3);
    choc::text::CodePrinter::append(this_00,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  text_01._M_str = "()";
  text_01._M_len = 2;
  choc::text::CodePrinter::writeBlock(this->out,text_01);
  return;
}

Assistant:

void printArgList (const ArrayView<pool_ref<heart::Expression>>& args)
        {
            if (args.empty())
            {
                out << "()";
                return;
            }

            out << " (";
            bool isFirst = true;

            for (auto& arg : args)
            {
                if (isFirst)
                    isFirst = false;
                else
                    out << ", ";

                printExpression (arg);
            }

            out << ')';
        }